

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int convert(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<float> v_01;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  Point2i p_04;
  Point2i p_05;
  string_view str;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  WrapMode2D wrapMode_04;
  WrapMode2D wrapMode_05;
  WrapMode2D wrapMode_06;
  WrapMode2D wrapMode_07;
  Point2i p_06;
  Point2i p_07;
  Point2i p_08;
  Point2i p_09;
  Point2i p_10;
  Point2i p_11;
  Point2i p_12;
  Point2i p_13;
  Point2i p_14;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  WrapMode2D wrapMode_08;
  WrapMode2D wrapMode_09;
  WrapMode2D wrapMode_10;
  Point2i p_15;
  Point2i p_16;
  Point2i p_17;
  Allocator alloc;
  Allocator alloc_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  Allocator alloc_01;
  WrapMode2D wrapMode_11;
  Point2i p_18;
  span<int> out;
  bool bVar3;
  byte bVar4;
  PixelFormat PVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  reference pvVar9;
  RGBColorSpace **ppRVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  float *pfVar14;
  long *in_RSI;
  size_type __n;
  Float FVar15;
  double dVar16;
  undefined1 extraout_var [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  RGB RVar20;
  int c_8;
  int xx;
  int x_8;
  int yy;
  int y_8;
  Image scaledImage;
  Float v;
  int c_7;
  int x_7;
  int y_7;
  anon_class_1_0_00000001 ACESFilm;
  int c_6;
  int c_5;
  Float m_1;
  int x_6;
  int y_6;
  int c_4;
  Float scale_1;
  Float lum;
  int x_5;
  int y_5;
  int c_3;
  int x_4;
  int y_4;
  int c_2;
  int x_3;
  int y_3;
  int mid;
  int dx;
  int dy;
  int validNeighbors;
  int x_2;
  int y_2;
  int i;
  vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> neighbors;
  int despikeCount;
  Image filteredImg;
  int c_1;
  int c;
  Float sum;
  int x_1;
  int y_1;
  RGB rgb;
  ImageChannelValues channels;
  int x;
  int y;
  SquareMatrix<3> m;
  RGBColorSpace *srcColorSpace;
  ImageChannelDesc rgbDesc;
  RGBColorSpace *dest;
  int nc;
  Point2i res;
  ImageChannelDesc desc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitChannelNames;
  string *name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool hasAOVs;
  ImageMetadata metadata;
  Image image;
  ImageAndMetadata imRead;
  anon_class_1_0_00000001 onError;
  array<int,_4UL> cropWindow;
  string channelNames;
  string colorspace;
  string outFile;
  string inFile;
  bool bw;
  bool preserveColors;
  Float despikeLimit;
  Float maxY;
  bool tonemap;
  bool flipy;
  int repeat;
  float gamma;
  float scale;
  bool acesFilmic;
  Image *in_stack_ffffffffffffe648;
  undefined4 in_stack_ffffffffffffe650;
  Float in_stack_ffffffffffffe654;
  undefined4 in_stack_ffffffffffffe658;
  WrapMode in_stack_ffffffffffffe65c;
  undefined4 in_stack_ffffffffffffe660;
  Float in_stack_ffffffffffffe664;
  size_t in_stack_ffffffffffffe668;
  ImageChannelValues *in_stack_ffffffffffffe670;
  Image *in_stack_ffffffffffffe678;
  undefined7 in_stack_ffffffffffffe680;
  undefined1 in_stack_ffffffffffffe687;
  Image *this;
  undefined1 in_stack_ffffffffffffe688 [64];
  undefined7 in_stack_ffffffffffffe6c8;
  char in_stack_ffffffffffffe6cf;
  int in_stack_ffffffffffffe6d0;
  WrapMode in_stack_ffffffffffffe6d4;
  WrapMode in_stack_ffffffffffffe6d8;
  int in_stack_ffffffffffffe6dc;
  int in_stack_ffffffffffffe6e0;
  undefined4 in_stack_ffffffffffffe6e4;
  undefined1 in_stack_ffffffffffffe6e8 [16];
  undefined1 auVar21 [16];
  Image *in_stack_ffffffffffffe6f8;
  undefined4 in_stack_ffffffffffffe720;
  undefined4 in_stack_ffffffffffffe724;
  undefined4 in_stack_ffffffffffffe728;
  undefined4 in_stack_ffffffffffffe72c;
  undefined4 in_stack_ffffffffffffe730;
  undefined4 in_stack_ffffffffffffe734;
  Image *in_stack_ffffffffffffe738;
  WrapMode in_stack_ffffffffffffe740;
  WrapMode in_stack_ffffffffffffe744;
  int in_stack_ffffffffffffe748;
  int in_stack_ffffffffffffe74c;
  undefined4 in_stack_ffffffffffffe750;
  undefined4 in_stack_ffffffffffffe754;
  undefined4 in_stack_ffffffffffffe758;
  undefined4 in_stack_ffffffffffffe75c;
  Float in_stack_ffffffffffffe760;
  undefined4 in_stack_ffffffffffffe764;
  Image *in_stack_ffffffffffffe768;
  undefined4 in_stack_ffffffffffffe770;
  Float in_stack_ffffffffffffe774;
  int in_stack_ffffffffffffe778;
  int in_stack_ffffffffffffe77c;
  Float in_stack_ffffffffffffe780;
  int in_stack_ffffffffffffe784;
  int in_stack_ffffffffffffe788;
  float in_stack_ffffffffffffe78c;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffe790;
  Bounds2i *in_stack_ffffffffffffe7a0;
  Image *in_stack_ffffffffffffe7a8;
  WrapMode in_stack_ffffffffffffe7b0;
  float fVar22;
  WrapMode in_stack_ffffffffffffe7b4;
  int in_stack_ffffffffffffe7b8;
  int in_stack_ffffffffffffe7bc;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffe820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe828;
  Tuple2<pbrt::Point2,_int> TVar23;
  undefined7 in_stack_ffffffffffffe830;
  undefined1 in_stack_ffffffffffffe837;
  char ***in_stack_ffffffffffffe838;
  string *local_17b8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffe868;
  string *in_stack_ffffffffffffe870;
  char ***in_stack_ffffffffffffe878;
  int *in_stack_ffffffffffffe880;
  size_t in_stack_ffffffffffffe888;
  byte local_16f6;
  bool local_15b1;
  optional<float> local_1598;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_1590;
  undefined4 local_1550;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_154c;
  undefined4 local_150c;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_1508;
  undefined4 local_14f8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_14f4;
  undefined4 local_14ec;
  optional<int> local_14e8;
  optional<float> local_14e0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  Tuple2<pbrt::Point2,_int> local_1494;
  int local_1474;
  int local_1470;
  int local_146c;
  int local_1468;
  int local_1464;
  Image *local_1460;
  Float local_12ec;
  int local_12e8;
  int local_12e4;
  int local_12e0;
  int local_12c0;
  Float local_12ac;
  int local_12a8;
  float local_1294;
  int local_1290;
  int local_128c;
  int local_1270;
  float local_126c;
  float local_1224;
  int local_1220;
  int local_121c;
  Float local_1208;
  float local_1204 [3];
  int local_11f8;
  int local_11f4;
  int local_11f0;
  int local_11d4;
  int local_11d0;
  int local_11cc;
  int local_11bc;
  int local_1174;
  int local_1170;
  int local_116c;
  ImageMetadata *in_stack_ffffffffffffeeb0;
  string *in_stack_ffffffffffffeeb8;
  Image *in_stack_ffffffffffffeec0;
  int local_1128;
  int local_1124;
  int local_10ec;
  vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> local_10e8;
  uint local_10cc;
  int local_fa8;
  int local_f94;
  float local_f90;
  int local_f8c;
  int local_f88;
  undefined4 local_f84;
  undefined4 local_f80;
  Float local_f7c;
  undefined4 *local_f78;
  undefined8 local_f70;
  undefined8 local_f50;
  Float local_f48;
  undefined8 local_f40;
  Float local_f38;
  ColorEncodingHandle *in_stack_fffffffffffff0e8;
  string *in_stack_fffffffffffff0f0;
  Allocator in_stack_fffffffffffff0f8;
  int local_eec;
  int local_ee8;
  allocator<char> local_eb3;
  allocator<char> local_eb2;
  allocator<char> local_eb1;
  string *local_eb0;
  string local_ea8 [32];
  undefined1 local_e88 [32];
  undefined1 local_e68 [32];
  string *local_e48;
  undefined8 local_e40;
  RGBColorSpace *local_df8;
  Tuple2<pbrt::Point2,_int> local_cd0;
  int local_b84;
  Tuple2<pbrt::Point2,_int> local_b80;
  undefined1 local_a18 [16];
  byte local_9eb;
  byte local_9ea;
  allocator<char> local_9e9;
  string local_9e8 [32];
  reference local_9c8;
  uint local_9bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9b0;
  undefined1 local_9a8 [24];
  undefined1 *local_990;
  byte local_981;
  optional local_8c0 [64];
  Image local_880 [2];
  byte local_539;
  byte local_513;
  byte local_512;
  allocator<char> local_511;
  string local_510 [39];
  byte local_4e9;
  byte local_4c3;
  byte local_4c2;
  allocator<char> local_4c1;
  string local_4c0 [39];
  byte local_499;
  byte local_473;
  byte local_472;
  allocator<char> local_471;
  string local_470 [39];
  byte local_449;
  byte local_423;
  byte local_422;
  allocator<char> local_421;
  string local_420 [39];
  byte local_3f9;
  byte local_3d3;
  byte local_3d2;
  allocator<char> local_3d1;
  string local_3d0 [39];
  byte local_3a9;
  byte local_383;
  byte local_382;
  allocator<char> local_381;
  string local_380 [39];
  byte local_359;
  byte local_333;
  byte local_332;
  allocator<char> local_331;
  string local_330 [39];
  byte local_309;
  byte local_2e3;
  byte local_2e2;
  allocator<char> local_2e1;
  string local_2e0 [39];
  byte local_2b9;
  byte local_293;
  byte local_292;
  allocator<char> local_291;
  string local_290 [39];
  byte local_269;
  span<int> local_248;
  byte local_233;
  byte local_232;
  allocator<char> local_231;
  string local_230 [39];
  byte local_209;
  byte local_1e3;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0 [39];
  byte local_1b9;
  byte local_193;
  byte local_192;
  allocator<char> local_191;
  string local_190 [39];
  byte local_169;
  byte local_143;
  byte local_142;
  allocator<char> local_141;
  string local_140 [87];
  allocator<char> local_e9;
  string local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [34];
  byte local_2e;
  byte local_2d;
  float local_2c;
  float local_28;
  byte local_22;
  byte local_21;
  int local_20;
  float local_1c;
  float local_18;
  byte local_11;
  long *local_10;
  int local_4;
  undefined1 auVar19 [56];
  
  local_11 = 0;
  local_18 = 1.0;
  local_1c = 1.0;
  local_20 = 1;
  local_21 = 0;
  local_22 = 0;
  local_28 = 1.0;
  local_2c = INFINITY;
  local_2d = 0;
  local_2e = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  std::__cxx11::string::string(local_b0);
  local_c0 = 0xffffffff;
  local_b8 = 0xffffffff;
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    local_142 = 0;
    local_143 = 0;
    local_169 = 0;
    local_192 = 0;
    local_193 = 0;
    local_1b9 = 0;
    local_1e2 = 0;
    local_1e3 = 0;
    local_209 = 0;
    local_232 = 0;
    local_233 = 0;
    local_269 = 0;
    local_292 = 0;
    local_293 = 0;
    local_2b9 = 0;
    local_2e2 = 0;
    local_2e3 = 0;
    local_309 = 0;
    local_332 = 0;
    local_333 = 0;
    local_359 = 0;
    local_382 = 0;
    local_383 = 0;
    local_3a9 = 0;
    local_3d2 = 0;
    local_3d3 = 0;
    local_3f9 = 0;
    local_422 = 0;
    local_423 = 0;
    local_449 = 0;
    local_472 = 0;
    local_473 = 0;
    local_499 = 0;
    local_4c2 = 0;
    local_4c3 = 0;
    local_4e9 = 0;
    local_512 = 0;
    local_513 = 0;
    local_539 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
    bVar3 = pbrt::ParseArg<bool*>
                      (in_stack_ffffffffffffe838,
                       (string *)CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830),
                       (bool *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
    local_15b1 = true;
    if (!bVar3) {
      std::allocator<char>::allocator();
      local_142 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
      local_143 = 1;
      std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                 (anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
      local_169 = 1;
      bVar3 = pbrt::ParseArg<bool*>
                        (in_stack_ffffffffffffe838,
                         (string *)CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830),
                         (bool *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
      local_15b1 = true;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_192 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680))
        ;
        local_193 = 1;
        std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                   (anon_class_1_0_00000001 *)
                   CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
        local_1b9 = 1;
        bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                          (in_stack_ffffffffffffe838,
                           (string *)CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830),
                           in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
        local_15b1 = true;
        if (!bVar3) {
          std::allocator<char>::allocator();
          local_1e2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
          local_1e3 = 1;
          std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     (anon_class_1_0_00000001 *)
                     CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
          local_209 = 1;
          bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                            (in_stack_ffffffffffffe838,
                             (string *)CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830)
                             ,in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
          local_15b1 = true;
          if (!bVar3) {
            std::allocator<char>::allocator();
            local_232 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
            local_233 = 1;
            local_248 = pstd::MakeSpan<std::array<int,_4UL>_>
                                  ((array<int,_4UL> *)
                                   CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
            std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
                      ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                       (anon_class_1_0_00000001 *)
                       CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
            local_269 = 1;
            out.n = in_stack_ffffffffffffe888;
            out.ptr = in_stack_ffffffffffffe880;
            bVar3 = pbrt::ParseArg<pstd::span<int>>
                              (in_stack_ffffffffffffe878,in_stack_ffffffffffffe870,out,
                               in_stack_ffffffffffffe868);
            local_15b1 = true;
            if (!bVar3) {
              std::allocator<char>::allocator();
              local_292 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                         (allocator<char> *)
                         CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
              local_293 = 1;
              std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
                        ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                         (anon_class_1_0_00000001 *)
                         CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
              local_2b9 = 1;
              bVar3 = pbrt::ParseArg<float*>
                                (in_stack_ffffffffffffe838,
                                 (string *)
                                 CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830),
                                 (float *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
              local_15b1 = true;
              if (!bVar3) {
                std::allocator<char>::allocator();
                local_2e2 = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                           (allocator<char> *)
                           CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
                local_2e3 = 1;
                std::function<void(std::__cxx11::string)>::function<convert(int,char**)::__0&,void>
                          ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                           (anon_class_1_0_00000001 *)
                           CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
                local_309 = 1;
                bVar3 = pbrt::ParseArg<bool*>
                                  (in_stack_ffffffffffffe838,
                                   (string *)
                                   CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830),
                                   (bool *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
                local_15b1 = true;
                if (!bVar3) {
                  std::allocator<char>::allocator();
                  local_332 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                             (allocator<char> *)
                             CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
                  local_333 = 1;
                  std::function<void(std::__cxx11::string)>::
                  function<convert(int,char**)::__0&,void>
                            ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                             (anon_class_1_0_00000001 *)
                             CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
                  local_359 = 1;
                  bVar3 = pbrt::ParseArg<float*>
                                    (in_stack_ffffffffffffe838,
                                     (string *)
                                     CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830),
                                     (float *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
                  local_15b1 = true;
                  if (!bVar3) {
                    std::allocator<char>::allocator();
                    local_382 = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                               (allocator<char> *)
                               CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
                    local_383 = 1;
                    std::function<void(std::__cxx11::string)>::
                    function<convert(int,char**)::__0&,void>
                              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                               (anon_class_1_0_00000001 *)
                               CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
                    local_3a9 = 1;
                    bVar3 = pbrt::ParseArg<float*>
                                      (in_stack_ffffffffffffe838,
                                       (string *)
                                       CONCAT17(in_stack_ffffffffffffe837,in_stack_ffffffffffffe830)
                                       ,(float *)in_stack_ffffffffffffe828,in_stack_ffffffffffffe820
                                      );
                    local_15b1 = true;
                    if (!bVar3) {
                      std::allocator<char>::allocator();
                      local_3d2 = 1;
                      std::__cxx11::string::string<std::allocator<char>>
                                (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                                 (allocator<char> *)
                                 CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
                      local_3d3 = 1;
                      std::function<void(std::__cxx11::string)>::
                      function<convert(int,char**)::__0&,void>
                                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                  *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                                 (anon_class_1_0_00000001 *)
                                 CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
                      local_3f9 = 1;
                      bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                                        (in_stack_ffffffffffffe838,
                                         (string *)
                                         CONCAT17(in_stack_ffffffffffffe837,
                                                  in_stack_ffffffffffffe830),
                                         in_stack_ffffffffffffe828,in_stack_ffffffffffffe820);
                      local_15b1 = true;
                      if (!bVar3) {
                        std::allocator<char>::allocator();
                        local_422 = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                                   (allocator<char> *)
                                   CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
                        local_423 = 1;
                        std::function<void(std::__cxx11::string)>::
                        function<convert(int,char**)::__0&,void>
                                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                    *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                                   (anon_class_1_0_00000001 *)
                                   CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
                        local_449 = 1;
                        bVar3 = pbrt::ParseArg<bool*>
                                          (in_stack_ffffffffffffe838,
                                           (string *)
                                           CONCAT17(in_stack_ffffffffffffe837,
                                                    in_stack_ffffffffffffe830),
                                           (bool *)in_stack_ffffffffffffe828,
                                           in_stack_ffffffffffffe820);
                        local_15b1 = true;
                        if (!bVar3) {
                          std::allocator<char>::allocator();
                          local_472 = 1;
                          std::__cxx11::string::string<std::allocator<char>>
                                    (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_
                                     ,(allocator<char> *)
                                      CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680))
                          ;
                          local_473 = 1;
                          std::function<void(std::__cxx11::string)>::
                          function<convert(int,char**)::__0&,void>
                                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660
                                                ),
                                     (anon_class_1_0_00000001 *)
                                     CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
                          local_499 = 1;
                          bVar3 = pbrt::ParseArg<int*>
                                            (in_stack_ffffffffffffe838,
                                             (string *)
                                             CONCAT17(in_stack_ffffffffffffe837,
                                                      in_stack_ffffffffffffe830),
                                             (int *)in_stack_ffffffffffffe828,
                                             in_stack_ffffffffffffe820);
                          local_15b1 = true;
                          if (!bVar3) {
                            std::allocator<char>::allocator();
                            local_4c2 = 1;
                            std::__cxx11::string::string<std::allocator<char>>
                                      (in_stack_ffffffffffffe688._8_8_,
                                       in_stack_ffffffffffffe688._0_8_,
                                       (allocator<char> *)
                                       CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680)
                                      );
                            local_4c3 = 1;
                            std::function<void(std::__cxx11::string)>::
                            function<convert(int,char**)::__0&,void>
                                      ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)CONCAT44(in_stack_ffffffffffffe664,
                                                   in_stack_ffffffffffffe660),
                                       (anon_class_1_0_00000001 *)
                                       CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658)
                                      );
                            local_4e9 = 1;
                            bVar3 = pbrt::ParseArg<float*>
                                              (in_stack_ffffffffffffe838,
                                               (string *)
                                               CONCAT17(in_stack_ffffffffffffe837,
                                                        in_stack_ffffffffffffe830),
                                               (float *)in_stack_ffffffffffffe828,
                                               in_stack_ffffffffffffe820);
                            local_15b1 = true;
                            if (!bVar3) {
                              std::allocator<char>::allocator();
                              local_512 = 1;
                              std::__cxx11::string::string<std::allocator<char>>
                                        (in_stack_ffffffffffffe688._8_8_,
                                         in_stack_ffffffffffffe688._0_8_,
                                         (allocator<char> *)
                                         CONCAT17(in_stack_ffffffffffffe687,
                                                  in_stack_ffffffffffffe680));
                              local_513 = 1;
                              std::function<void(std::__cxx11::string)>::
                              function<convert(int,char**)::__0&,void>
                                        ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                          *)CONCAT44(in_stack_ffffffffffffe664,
                                                     in_stack_ffffffffffffe660),
                                         (anon_class_1_0_00000001 *)
                                         CONCAT44(in_stack_ffffffffffffe65c,
                                                  in_stack_ffffffffffffe658));
                              local_539 = 1;
                              local_15b1 = pbrt::ParseArg<bool*>
                                                     (in_stack_ffffffffffffe838,
                                                      (string *)
                                                      CONCAT17(in_stack_ffffffffffffe837,
                                                               in_stack_ffffffffffffe830),
                                                      (bool *)in_stack_ffffffffffffe828,
                                                      in_stack_ffffffffffffe820);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_539 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de210);
    }
    if ((local_513 & 1) != 0) {
      std::__cxx11::string::~string(local_510);
    }
    if ((local_512 & 1) != 0) {
      std::allocator<char>::~allocator(&local_511);
    }
    if ((local_4e9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de25b);
    }
    if ((local_4c3 & 1) != 0) {
      std::__cxx11::string::~string(local_4c0);
    }
    if ((local_4c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_4c1);
    }
    if ((local_499 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de2a6);
    }
    if ((local_473 & 1) != 0) {
      std::__cxx11::string::~string(local_470);
    }
    if ((local_472 & 1) != 0) {
      std::allocator<char>::~allocator(&local_471);
    }
    if ((local_449 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de2f1);
    }
    if ((local_423 & 1) != 0) {
      std::__cxx11::string::~string(local_420);
    }
    if ((local_422 & 1) != 0) {
      std::allocator<char>::~allocator(&local_421);
    }
    if ((local_3f9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de33c);
    }
    if ((local_3d3 & 1) != 0) {
      std::__cxx11::string::~string(local_3d0);
    }
    if ((local_3d2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_3d1);
    }
    if ((local_3a9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de387);
    }
    if ((local_383 & 1) != 0) {
      std::__cxx11::string::~string(local_380);
    }
    if ((local_382 & 1) != 0) {
      std::allocator<char>::~allocator(&local_381);
    }
    if ((local_359 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de3d2);
    }
    if ((local_333 & 1) != 0) {
      std::__cxx11::string::~string(local_330);
    }
    if ((local_332 & 1) != 0) {
      std::allocator<char>::~allocator(&local_331);
    }
    if ((local_309 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de41d);
    }
    if ((local_2e3 & 1) != 0) {
      std::__cxx11::string::~string(local_2e0);
    }
    if ((local_2e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_2e1);
    }
    if ((local_2b9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de468);
    }
    if ((local_293 & 1) != 0) {
      std::__cxx11::string::~string(local_290);
    }
    if ((local_292 & 1) != 0) {
      std::allocator<char>::~allocator(&local_291);
    }
    if ((local_269 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de4b3);
    }
    if ((local_233 & 1) != 0) {
      std::__cxx11::string::~string(local_230);
    }
    if ((local_232 & 1) != 0) {
      std::allocator<char>::~allocator(&local_231);
    }
    if ((local_209 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de4fe);
    }
    if ((local_1e3 & 1) != 0) {
      std::__cxx11::string::~string(local_1e0);
    }
    if ((local_1e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1e1);
    }
    if ((local_1b9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de549);
    }
    if ((local_193 & 1) != 0) {
      std::__cxx11::string::~string(local_190);
    }
    if ((local_192 & 1) != 0) {
      std::allocator<char>::~allocator(&local_191);
    }
    if ((local_169 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3de594);
    }
    if ((local_143 & 1) != 0) {
      std::__cxx11::string::~string(local_140);
    }
    if ((local_142 & 1) != 0) {
      std::allocator<char>::~allocator(&local_141);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3de5d3);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    if (local_15b1 == false) {
      if ((*(char *)*local_10 == '-') || (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0))
      {
        usage("convert","%s: unknown command flag",*local_10);
      }
      else {
        std::__cxx11::string::operator=(local_50,(char *)*local_10);
        local_10 = local_10 + 1;
      }
    }
  }
  if (local_28 <= 0.0) {
    usage("convert","--maxluminance value must be greater than zero");
  }
  if (local_20 < 1) {
    usage("convert","--repeatpix value must be greater than zero");
  }
  if ((local_18 == 0.0) && (!NAN(local_18))) {
    usage("convert","--scale value must be non-zero");
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    usage("convert","--outfile filename must be specified");
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    usage("convert","input filename not specified");
  }
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
             in_stack_ffffffffffffe648);
  pbrt::Image::Read(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0f8,in_stack_fffffffffffff0e8);
  pbrt::Image::Image((Image *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680),
                     in_stack_ffffffffffffe678);
  pbrt::ImageMetadata::ImageMetadata
            (in_stack_ffffffffffffe688._24_8_,in_stack_ffffffffffffe688._16_8_);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    local_981 = 0;
    pbrt::Image::ChannelNames_abi_cxx11_(in_stack_ffffffffffffe688._0_8_);
    local_990 = local_9a8;
    local_9b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe648);
    local_9b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffe648);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffe648), bVar3) {
      local_9c8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_9b0);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                              (char *)in_stack_ffffffffffffe648);
      if ((((bVar3) &&
           (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650)
                                    ,(char *)in_stack_ffffffffffffe648), bVar3)) &&
          (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                                   (char *)in_stack_ffffffffffffe648), bVar3)) &&
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                                  (char *)in_stack_ffffffffffffe648), bVar3)) {
        local_981 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_9b0);
    }
    local_9bc = 4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660));
    local_9ea = 0;
    local_9eb = 0;
    local_16f6 = 0;
    if ((local_981 & 1) != 0) {
      std::allocator<char>::allocator();
      local_9ea = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
      local_9eb = 1;
      bVar3 = pbrt::HasExtension((string *)
                                 CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffe724,in_stack_ffffffffffffe720));
      local_16f6 = bVar3 ^ 0xff;
    }
    if ((local_9eb & 1) != 0) {
      std::__cxx11::string::~string(local_9e8);
    }
    if ((local_9ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_9e9);
    }
    TVar23 = _stderr;
    if ((local_16f6 & 1) != 0) {
      uVar7 = std::__cxx11::string::c_str();
      fprintf((FILE *)TVar23,
              "%s: image has non-RGB channels but converting to an image format that can\'t store them. Converting RGB only.\n"
              ,uVar7);
      std::__cxx11::string::operator=(local_b0,"R,G,B");
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    local_a18 = std::__cxx11::string::operator_cast_to_basic_string_view(local_b0);
    str._M_len._4_4_ = in_stack_ffffffffffffe6d4;
    str._M_len._0_4_ = in_stack_ffffffffffffe6d0;
    str._M_str._0_4_ = in_stack_ffffffffffffe6d8;
    str._M_str._4_4_ = in_stack_ffffffffffffe6dc;
    pbrt::SplitString_abi_cxx11_(str,in_stack_ffffffffffffe6cf);
    pstd::span<std::__cxx11::string_const>::
    span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
    requestedChannels.ptr._4_4_ = in_stack_ffffffffffffe734;
    requestedChannels.ptr._0_4_ = in_stack_ffffffffffffe730;
    requestedChannels.n = (size_t)in_stack_ffffffffffffe738;
    pbrt::Image::GetChannelDesc
              ((Image *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),
               requestedChannels);
    bVar3 = pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x3df2fe);
    TVar23 = _stderr;
    if (bVar3) {
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)
                 CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
      alloc.memoryResource._4_4_ = in_stack_ffffffffffffe75c;
      alloc.memoryResource._0_4_ = in_stack_ffffffffffffe758;
      pbrt::Image::SelectChannels
                ((Image *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                 (ImageChannelDesc *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748),
                 alloc);
      pbrt::Image::operator=
                ((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648);
      pbrt::Image::~Image((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
    }
    else {
      uVar7 = std::__cxx11::string::c_str();
      uVar8 = std::__cxx11::string::c_str();
      fprintf((FILE *)TVar23,"%s: image doesn\'t have channels \"%s\".\n",uVar7,uVar8);
      local_4 = 1;
    }
    local_9bc = (uint)!bVar3;
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3df42a);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660));
    if (local_9bc != 0) goto LAB_003e16a7;
  }
  local_b80 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_880);
  local_b84 = pbrt::Image::NChannels((Image *)0x3df4be);
  pvVar9 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                      (size_type)in_stack_ffffffffffffe648);
  if (*pvVar9 < 0) {
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    iVar1 = *pvVar9;
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    iVar2 = *pvVar9;
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    *pvVar9 = iVar1 - iVar2;
  }
  pvVar9 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                      (size_type)in_stack_ffffffffffffe648);
  if (*pvVar9 < 0) {
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    iVar1 = *pvVar9;
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    iVar2 = *pvVar9;
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    *pvVar9 = iVar1 - iVar2;
  }
  pvVar9 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)
                      CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                      (size_type)in_stack_ffffffffffffe648);
  if (-1 < *pvVar9) {
    pvVar9 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)
                        CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                        (size_type)in_stack_ffffffffffffe648);
    if (-1 < *pvVar9) {
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (size_type)in_stack_ffffffffffffe648);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (size_type)in_stack_ffffffffffffe648);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (size_type)in_stack_ffffffffffffe648);
      std::array<int,_4UL>::operator[]
                ((array<int,_4UL> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (size_type)in_stack_ffffffffffffe648);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648);
      pbrt::Bounds2<int>::Bounds2
                ((Bounds2<int> *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                 (Point2<int> *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658),
                 (Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)
                 CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
      alloc_01.memoryResource._4_4_ = in_stack_ffffffffffffe7b4;
      alloc_01.memoryResource._0_4_ = in_stack_ffffffffffffe7b0;
      pbrt::Image::Crop(in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0,alloc_01);
      pbrt::Image::operator=
                ((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 in_stack_ffffffffffffe648);
      pbrt::Image::~Image((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
      local_cd0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_880);
      local_b80 = local_cd0;
    }
  }
  PVar5 = pbrt::Image::Format(local_880);
  bVar3 = pbrt::Is32Bit(PVar5);
  if (!bVar3) {
    pbrt::ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
               in_stack_ffffffffffffe648);
    pbrt::Image::ConvertToFormat
              (in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6e8._12_4_,
               in_stack_ffffffffffffe6e8._0_8_);
    pbrt::Image::operator=
              ((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
               in_stack_ffffffffffffe648);
    pbrt::Image::~Image((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    local_df8 = pbrt::RGBColorSpace::GetNamed(in_stack_ffffffffffffe688._48_8_);
    if (local_df8 == (RGBColorSpace *)0x0) {
      TVar23 = _stderr;
      uVar7 = std::__cxx11::string::c_str();
      fprintf((FILE *)TVar23,"%s: color space unknown.\n",uVar7);
      local_4 = 1;
      local_9bc = 1;
      goto LAB_003e16a7;
    }
    local_eb0 = local_ea8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_eb0 = (string *)local_e88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_eb0 = (string *)local_e68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe688._8_8_,in_stack_ffffffffffffe688._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_e48 = local_ea8;
    local_e40 = 3;
    v_00._M_array._4_4_ = in_stack_ffffffffffffe65c;
    v_00._M_array._0_4_ = in_stack_ffffffffffffe658;
    v_00._M_len._0_4_ = in_stack_ffffffffffffe660;
    v_00._M_len._4_4_ = in_stack_ffffffffffffe664;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),v_00);
    requestedChannels_00.ptr._4_4_ = in_stack_ffffffffffffe734;
    requestedChannels_00.ptr._0_4_ = in_stack_ffffffffffffe730;
    requestedChannels_00.n = (size_t)in_stack_ffffffffffffe738;
    pbrt::Image::GetChannelDesc
              ((Image *)CONCAT44(in_stack_ffffffffffffe72c,in_stack_ffffffffffffe728),
               requestedChannels_00);
    local_17b8 = (string *)&local_e48;
    do {
      local_17b8 = local_17b8 + -0x20;
      std::__cxx11::string::~string(local_17b8);
    } while (local_17b8 != local_ea8);
    std::allocator<char>::~allocator(&local_eb3);
    std::allocator<char>::~allocator(&local_eb2);
    auVar18._0_8_ = std::allocator<char>::~allocator(&local_eb1);
    auVar18._8_56_ = extraout_var;
    bVar3 = pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x3dfa8e);
    if (bVar3) {
      bVar3 = pstd::optional::operator_cast_to_bool(local_8c0);
      if (bVar3) {
        ppRVar10 = pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                             ((optional<const_pbrt::RGBColorSpace_*> *)0x3dfc81);
        if (*ppRVar10 != (RGBColorSpace *)0x0) {
          pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                    ((optional<const_pbrt::RGBColorSpace_*> *)0x3dfca6);
        }
      }
      pbrt::ConvertRGBColorSpace
                ((RGBColorSpace *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                 (RGBColorSpace *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
      for (local_ee8 = 0; local_ee8 < local_b80.y; local_ee8 = local_ee8 + 1) {
        local_eec = 0;
        while( true ) {
          auVar19 = auVar18._8_56_;
          if (local_b80.x <= local_eec) break;
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_18.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe7bc;
          p_18.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe7b8;
          wrapMode_11.wrap.values[1] = in_stack_ffffffffffffe7b4;
          wrapMode_11.wrap.values[0] = in_stack_ffffffffffffe7b0;
          pbrt::Image::GetChannels
                    (in_stack_ffffffffffffe7a8,p_18,(ImageChannelDesc *)in_stack_ffffffffffffe7a0,
                     wrapMode_11);
          RVar20 = pbrt::Mul<pbrt::RGB,3,pbrt::ImageChannelValues>
                             ((SquareMatrix<3> *)
                              CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680),
                              (ImageChannelValues *)in_stack_ffffffffffffe678);
          local_f48 = RVar20.b;
          auVar17._0_8_ = RVar20._0_8_;
          auVar17._8_56_ = auVar19;
          local_f50 = vmovlpd_avx(auVar17._0_16_);
          local_f40 = local_f50;
          local_f38 = local_f48;
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          local_f84 = (undefined4)local_f40;
          local_f80 = local_f40._4_4_;
          auVar18 = ZEXT464((uint)local_f38);
          local_f7c = local_f38;
          local_f78 = &local_f84;
          local_f70 = 3;
          v_01._M_array._4_4_ = in_stack_ffffffffffffe65c;
          v_01._M_array._0_4_ = in_stack_ffffffffffffe658;
          v_01._M_len._0_4_ = in_stack_ffffffffffffe660;
          v_01._M_len._4_4_ = in_stack_ffffffffffffe664;
          pstd::span<const_float>::span
                    ((span<const_float> *)
                     CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),v_01);
          pbrt::Image::SetChannels
                    (in_stack_ffffffffffffe688._24_8_,(Point2i)in_stack_ffffffffffffe688._48_8_,
                     in_stack_ffffffffffffe688._16_8_,in_stack_ffffffffffffe688._32_16_);
          pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3dfed9);
          local_eec = local_eec + 1;
        }
      }
      pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
                ((optional<const_pbrt::RGBColorSpace_*> *)
                 CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (RGBColorSpace **)in_stack_ffffffffffffe648);
      local_9bc = 0;
    }
    else {
      TVar23 = _stderr;
      uVar7 = std::__cxx11::string::c_str();
      fprintf((FILE *)TVar23,"%s: doesn\'t have R, G, B channels.\n",uVar7);
      local_4 = 1;
      local_9bc = 1;
    }
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3dff59);
    if (local_9bc != 0) goto LAB_003e16a7;
  }
  if ((local_2e & 1) != 0) {
    for (local_f88 = 0; local_f88 < local_b80.y; local_f88 = local_f88 + 1) {
      for (local_f8c = 0; local_f8c < local_b80.x; local_f8c = local_f8c + 1) {
        local_f90 = 0.0;
        for (local_f94 = 0; local_f94 < local_b84; local_f94 = local_f94 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_06.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_06.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode.wrap.values[0] = in_stack_ffffffffffffe6d4;
          FVar15 = pbrt::Image::GetChannel
                             ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8)
                              ,p_06,in_stack_ffffffffffffe688._60_4_,wrapMode);
          local_f90 = FVar15 + local_f90;
        }
        local_f90 = local_f90 / (float)local_b84;
        for (local_fa8 = 0; local_fa8 < local_b84; local_fa8 = local_fa8 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
          p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
          pbrt::Image::SetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p,
                     in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
        }
      }
    }
  }
  if (local_2c < INFINITY) {
    pbrt::Image::Image((Image *)CONCAT44(in_stack_ffffffffffffe6e4,in_stack_ffffffffffffe6e0),
                       (Image *)CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8));
    local_10cc = 0;
    std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::vector
              ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
               0x3e01a0);
    for (local_10ec = 0; local_10ec < 9; local_10ec = local_10ec + 1) {
      pbrt::Image::NChannels((Image *)0x3e01c6);
      pbrt::ImageChannelValues::ImageChannelValues
                (in_stack_ffffffffffffe670,in_stack_ffffffffffffe668,in_stack_ffffffffffffe664);
      std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::push_back
                ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
                 CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                 (value_type *)in_stack_ffffffffffffe648);
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e0210);
    }
    for (local_1124 = 0; local_1124 < local_b80.y; local_1124 = local_1124 + 1) {
      for (local_1128 = 0; local_1128 < local_b80.x; local_1128 = local_1128 + 1) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                   (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                   in_stack_ffffffffffffe65c);
        p_15.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe74c;
        p_15.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe748;
        wrapMode_08.wrap.values[1] = in_stack_ffffffffffffe744;
        wrapMode_08.wrap.values[0] = in_stack_ffffffffffffe740;
        pbrt::Image::GetChannels(in_stack_ffffffffffffe738,p_15,wrapMode_08);
        FVar15 = pbrt::ImageChannelValues::Average
                           ((ImageChannelValues *)
                            CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660));
        fVar22 = local_2c;
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e032f);
        if (fVar22 <= FVar15) {
          local_10cc = local_10cc + 1;
          local_116c = 0;
          for (local_1170 = -1; local_1170 < 2; local_1170 = local_1170 + 1) {
            if ((-1 < local_1124 + local_1170) && (local_1124 + local_1170 < local_b80.y)) {
              for (local_1174 = -1; local_1174 < 2; local_1174 = local_1174 + 1) {
                if ((-1 < local_1128 + local_1174) && (local_1128 + local_1174 <= local_b80.x)) {
                  pbrt::Point2<int>::Point2
                            ((Point2<int> *)
                             CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                             (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),
                             (int)in_stack_ffffffffffffe648);
                  pbrt::WrapMode2D::WrapMode2D
                            ((WrapMode2D *)
                             CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                             in_stack_ffffffffffffe65c);
                  p_16.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe74c;
                  p_16.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe748;
                  wrapMode_09.wrap.values[1] = in_stack_ffffffffffffe744;
                  wrapMode_09.wrap.values[0] = in_stack_ffffffffffffe740;
                  pbrt::Image::GetChannels(in_stack_ffffffffffffe738,p_16,wrapMode_09);
                  __n = (size_type)local_116c;
                  local_116c = local_116c + 1;
                  std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::
                  operator[](&local_10e8,__n);
                  pbrt::ImageChannelValues::operator=
                            ((ImageChannelValues *)
                             CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                             (ImageChannelValues *)in_stack_ffffffffffffe648);
                  pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e04c7);
                }
              }
            }
          }
          local_11bc = local_116c / 2;
          pvVar11 = std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                    ::operator[](&local_10e8,0);
          pvVar12 = std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                    ::operator[](&local_10e8,(long)local_11bc);
          pvVar13 = std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>
                    ::operator[](&local_10e8,(long)local_116c);
          std::nth_element<pbrt::ImageChannelValues*,convert(int,char**)::__1>
                    (pvVar11,pvVar12,pvVar13);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::
          operator[](&local_10e8,(long)local_11bc);
          pbrt::Image::SetChannels
                    (in_stack_ffffffffffffe688._24_8_,(Point2i)in_stack_ffffffffffffe688._32_8_,
                     in_stack_ffffffffffffe688._16_8_);
        }
      }
    }
    pstd::swap<pbrt::Image>
              ((Image *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               in_stack_ffffffffffffe768);
    in_stack_ffffffffffffe790 = _stderr;
    uVar7 = std::__cxx11::string::c_str();
    fprintf((FILE *)in_stack_ffffffffffffe790,"%s: despiked %d pixels\n",uVar7,(ulong)local_10cc);
    std::vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_>::~vector
              ((vector<pbrt::ImageChannelValues,_std::allocator<pbrt::ImageChannelValues>_> *)
               CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660));
    pbrt::Image::~Image((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  }
  if ((local_18 != 1.0) || (NAN(local_18))) {
    for (local_11cc = 0; local_11cc < local_b80.y; local_11cc = local_11cc + 1) {
      for (local_11d0 = 0; local_11d0 < local_b80.x; local_11d0 = local_11d0 + 1) {
        for (local_11d4 = 0; local_11d4 < local_b84; local_11d4 = local_11d4 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          in_stack_ffffffffffffe788 = local_11d4;
          in_stack_ffffffffffffe78c = local_18;
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          in_stack_ffffffffffffe784 = local_11d4;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_07.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_07.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode_00.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode_00.wrap.values[0] = in_stack_ffffffffffffe6d4;
          in_stack_ffffffffffffe780 =
               pbrt::Image::GetChannel
                         ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),
                          p_07,in_stack_ffffffffffffe688._60_4_,wrapMode_00);
          p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
          p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
          pbrt::Image::SetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_00,
                     in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
        }
      }
    }
  }
  if ((local_1c != 1.0) || (NAN(local_1c))) {
    for (local_11f0 = 0; local_11f0 < local_b80.y; local_11f0 = local_11f0 + 1) {
      for (local_11f4 = 0; local_11f4 < local_b80.x; local_11f4 = local_11f4 + 1) {
        for (local_11f8 = 0; local_11f8 < local_b84; local_11f8 = local_11f8 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          local_1204[0] = 0.0;
          in_stack_ffffffffffffe77c = local_11f8;
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          in_stack_ffffffffffffe778 = local_11f8;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_08.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_08.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode_01.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode_01.wrap.values[0] = in_stack_ffffffffffffe6d4;
          in_stack_ffffffffffffe774 =
               pbrt::Image::GetChannel
                         ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),
                          p_08,in_stack_ffffffffffffe688._60_4_,wrapMode_01);
          local_1208 = in_stack_ffffffffffffe774;
          in_stack_ffffffffffffe768 = (Image *)std::max<float>(local_1204,&local_1208);
          dVar16 = std::pow((double)(ulong)in_stack_ffffffffffffe768->format,
                            (double)(ulong)(uint)local_1c);
          in_stack_ffffffffffffe764 = SUB84(dVar16,0);
          p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
          p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
          pbrt::Image::SetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_01,
                     in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
        }
      }
    }
  }
  if ((local_22 & 1) != 0) {
    for (local_121c = 0; local_121c < local_b80.y; local_121c = local_121c + 1) {
      for (local_1220 = 0; local_1220 < local_b80.x; local_1220 = local_1220 + 1) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                   (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                   in_stack_ffffffffffffe65c);
        p_17.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe74c;
        p_17.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe748;
        wrapMode_10.wrap.values[1] = in_stack_ffffffffffffe744;
        wrapMode_10.wrap.values[0] = in_stack_ffffffffffffe740;
        pbrt::Image::GetChannels(in_stack_ffffffffffffe738,p_17,wrapMode_10);
        in_stack_ffffffffffffe760 =
             pbrt::ImageChannelValues::Average
                       ((ImageChannelValues *)
                        CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660));
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e0aff);
        local_126c = (in_stack_ffffffffffffe760 / (local_28 * local_28) + 1.0) /
                     (in_stack_ffffffffffffe760 + 1.0);
        local_1224 = in_stack_ffffffffffffe760;
        for (local_1270 = 0; local_1270 < local_b84; local_1270 = local_1270 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_09.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_09.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode_02.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode_02.wrap.values[0] = in_stack_ffffffffffffe6d4;
          pbrt::Image::GetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_09,
                     in_stack_ffffffffffffe688._60_4_,wrapMode_02);
          p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
          p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
          pbrt::Image::SetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_02,
                     in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
        }
      }
    }
  }
  if ((local_2d & 1) != 0) {
    for (local_128c = 0; local_128c < local_b80.y; local_128c = local_128c + 1) {
      for (local_1290 = 0; local_1290 < local_b80.x; local_1290 = local_1290 + 1) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                   (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                   in_stack_ffffffffffffe65c);
        p_10.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
        p_10.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
        wrapMode_03.wrap.values[1] = in_stack_ffffffffffffe6d8;
        wrapMode_03.wrap.values[0] = in_stack_ffffffffffffe6d4;
        local_1294 = pbrt::Image::GetChannel
                               ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,
                                                  in_stack_ffffffffffffe6c8),p_10,
                                in_stack_ffffffffffffe688._60_4_,wrapMode_03);
        for (local_12a8 = 1; local_12a8 < local_b84; local_12a8 = local_12a8 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_11.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_11.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode_04.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode_04.wrap.values[0] = in_stack_ffffffffffffe6d4;
          local_12ac = pbrt::Image::GetChannel
                                 ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,
                                                    in_stack_ffffffffffffe6c8),p_11,
                                  in_stack_ffffffffffffe688._60_4_,wrapMode_04);
          pfVar14 = std::max<float>(&local_1294,&local_12ac);
          local_1294 = *pfVar14;
        }
        if (1.0 < local_1294) {
          for (local_12c0 = 0; local_12c0 < local_b84; local_12c0 = local_12c0 + 1) {
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                       (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),
                       (int)in_stack_ffffffffffffe648);
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                       (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),
                       (int)in_stack_ffffffffffffe648);
            pbrt::WrapMode2D::WrapMode2D
                      ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                       in_stack_ffffffffffffe65c);
            p_12.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
            p_12.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
            wrapMode_05.wrap.values[1] = in_stack_ffffffffffffe6d8;
            wrapMode_05.wrap.values[0] = in_stack_ffffffffffffe6d4;
            pbrt::Image::GetChannel
                      ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_12,
                       in_stack_ffffffffffffe688._60_4_,wrapMode_05);
            p_03.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
            p_03.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
            pbrt::Image::SetChannel
                      ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_03,
                       in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
          }
        }
      }
    }
  }
  PVar5 = (PixelFormat)((ulong)in_stack_ffffffffffffe768 >> 0x20);
  if ((local_11 & 1) != 0) {
    local_12e0 = 0;
    while( true ) {
      PVar5 = (PixelFormat)((ulong)in_stack_ffffffffffffe768 >> 0x20);
      if (local_b80.y <= local_12e0) break;
      for (local_12e4 = 0; local_12e4 < local_b80.x; local_12e4 = local_12e4 + 1) {
        for (local_12e8 = 0; local_12e8 < local_b84; local_12e8 = local_12e8 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_13.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_13.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode_06.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode_06.wrap.values[0] = in_stack_ffffffffffffe6d4;
          local_12ec = pbrt::Image::GetChannel
                                 ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,
                                                    in_stack_ffffffffffffe6c8),p_13,
                                  in_stack_ffffffffffffe688._60_4_,wrapMode_06);
          local_12ec = convert::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)
                                  CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658),
                                  in_stack_ffffffffffffe654);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648)
          ;
          p_04.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
          p_04.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
          pbrt::Image::SetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_04,
                     in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
        }
      }
      local_12e0 = local_12e0 + 1;
    }
  }
  this = in_stack_ffffffffffffe688._24_8_;
  if (1 < local_20) {
    pbrt::Image::Format(local_880);
    pbrt::Point2<int>::Point2
              ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
               (int)((ulong)in_stack_ffffffffffffe648 >> 0x20),(int)in_stack_ffffffffffffe648);
    pbrt::Image::ChannelNames_abi_cxx11_(in_stack_ffffffffffffe688._0_8_);
    pstd::span<std::__cxx11::string_const>::
    span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
    pbrt::Image::Encoding(in_stack_ffffffffffffe648);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
    channels_00.ptr._4_4_ = in_stack_ffffffffffffe784;
    channels_00.ptr._0_4_ = in_stack_ffffffffffffe780;
    channels_00.n._0_4_ = in_stack_ffffffffffffe788;
    channels_00.n._4_4_ = in_stack_ffffffffffffe78c;
    alloc_00.memoryResource._4_4_ = in_stack_ffffffffffffe77c;
    alloc_00.memoryResource._0_4_ = in_stack_ffffffffffffe778;
    pbrt::Image::Image((Image *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),PVar5,
                       (Point2i)in_stack_ffffffffffffe790,channels_00,
                       (ColorEncodingHandle *)
                       CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),alloc_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660));
    local_1464 = 0;
    while( true ) {
      this = in_stack_ffffffffffffe688._24_8_;
      if (local_20 * local_b80.y <= local_1464) break;
      local_1468 = local_1464 / local_20;
      for (local_146c = 0; local_146c < local_20 * local_b80.x; local_146c = local_146c + 1) {
        local_1470 = local_146c / local_20;
        for (local_1474 = 0; local_1474 < local_b84; local_1474 = local_1474 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)local_1460 >> 0x20),(int)local_1460);
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),
                     (int)((ulong)local_1460 >> 0x20),(int)local_1460);
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe65c);
          p_14.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6e0;
          p_14.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6dc;
          wrapMode_07.wrap.values[1] = in_stack_ffffffffffffe6d8;
          wrapMode_07.wrap.values[0] = in_stack_ffffffffffffe6d4;
          pbrt::Image::GetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_14,
                     in_stack_ffffffffffffe688._60_4_,wrapMode_07);
          p_05.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffe6d4;
          p_05.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffe6d0;
          pbrt::Image::SetChannel
                    ((Image *)CONCAT17(in_stack_ffffffffffffe6cf,in_stack_ffffffffffffe6c8),p_05,
                     in_stack_ffffffffffffe688._60_4_,in_stack_ffffffffffffe688._56_4_);
        }
      }
      local_1464 = local_1464 + 1;
    }
    pbrt::Image::operator=
              ((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650),local_1460);
    local_1494 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_880);
    local_b80 = local_1494;
    pbrt::Image::~Image((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  }
  if ((local_21 & 1) != 0) {
    pbrt::Image::FlipY(this);
  }
  local_1598.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_1598.set = false;
  local_1598._5_3_ = 0;
  pstd::optional<float>::optional(&local_1598);
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  local_1590 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
               vmovdqu64_avx512f(auVar18);
  local_1550 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_1590.__align);
  local_154c = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
               vmovdqu64_avx512f(auVar18);
  local_150c = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_154c.__align);
  auVar21 = (undefined1  [16])0x0;
  local_1508 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_14f8 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional
            ((optional<pbrt::Bounds2<int>_> *)&local_1508.__align);
  local_14ec = 0;
  local_14f4 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_14f4.__align);
  local_14e8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_14e8.set = false;
  local_14e8._5_3_ = 0;
  pstd::optional<int>::optional(&local_14e8);
  local_14e0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_14e0.set = false;
  local_14e0._5_3_ = 0;
  pstd::optional<float>::optional(&local_14e0);
  local_14d8 = auVar21._0_8_;
  uStack_14d0 = auVar21._8_8_;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_14d8.__align);
  uStack_14a8 = 0;
  uStack_14a0 = 0;
  local_14c8 = 0;
  uStack_14c0 = 0;
  uStack_14b8 = 0;
  uStack_14b0 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x3e1609);
  bVar3 = pbrt::Image::Write(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,
                             in_stack_ffffffffffffeeb0);
  bVar4 = bVar3 ^ 0xff;
  pbrt::ImageMetadata::~ImageMetadata
            ((ImageMetadata *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  if ((bVar4 & 1) == 0) {
    local_4 = 0;
    local_9bc = 1;
  }
  else {
    local_4 = 1;
    local_9bc = 1;
  }
LAB_003e16a7:
  pbrt::ImageMetadata::~ImageMetadata
            ((ImageMetadata *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  pbrt::Image::~Image((Image *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  pbrt::ImageAndMetadata::~ImageAndMetadata
            ((ImageAndMetadata *)CONCAT44(in_stack_ffffffffffffe654,in_stack_ffffffffffffe650));
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return local_4;
}

Assistant:

int convert(int argc, char *argv[]) {
    bool acesFilmic = false;
    float scale = 1.f, gamma = 1.f;
    int repeat = 1;
    bool flipy = false;
    bool tonemap = false;
    Float maxY = 1.;
    Float despikeLimit = Infinity;
    bool preserveColors = false;
    bool bw = false;
    std::string inFile, outFile;
    std::string colorspace;
    std::string channelNames;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("convert", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "acesfilmic", &acesFilmic, onError) ||
            ParseArg(&argv, "bw", &bw, onError) ||
            ParseArg(&argv, "channels", &channelNames, onError) ||
            ParseArg(&argv, "colorspace", &colorspace, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError) ||
            ParseArg(&argv, "despike", &despikeLimit, onError) ||
            ParseArg(&argv, "flipy", &flipy, onError) ||
            ParseArg(&argv, "gamma", &gamma, onError) ||
            ParseArg(&argv, "maxluminance", &maxY, onError) ||
            ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "preservecolors", &preserveColors, onError) ||
            ParseArg(&argv, "repeatpix", &repeat, onError) ||
            ParseArg(&argv, "scale", &scale, onError) ||
            ParseArg(&argv, "tonemap", &tonemap, onError)) {
            // success
        } else if (argv[0][0] != '-' && inFile.empty()) {
            inFile = *argv;
            ++argv;
        } else
            usage("convert", "%s: unknown command flag", *argv);
    }

    if (maxY <= 0)
        usage("convert", "--maxluminance value must be greater than zero");
    if (repeat <= 0)
        usage("convert", "--repeatpix value must be greater than zero");
    if (scale == 0)
        usage("convert", "--scale value must be non-zero");
    if (outFile.empty())
        usage("convert", "--outfile filename must be specified");
    if (inFile.empty())
        usage("convert", "input filename not specified");

    ImageAndMetadata imRead = Image::Read(inFile);
    Image image = std::move(imRead.image);
    ImageMetadata metadata = std::move(imRead.metadata);

    if (channelNames.empty()) {
        // If the input image has AOVs and the target image is a regular
        // format, then just grab R,G,B...
        bool hasAOVs = false;
        for (const std::string &name : image.ChannelNames())
            if (name != "R" && name != "G" && name != "B" && name != "A") {
                hasAOVs = true;
                break;
            }

        if (hasAOVs && !HasExtension(outFile, "exr")) {
            fprintf(stderr,
                    "%s: image has non-RGB channels but converting to an "
                    "image format that can't store them. Converting RGB only.\n",
                    inFile.c_str());
            channelNames = "R,G,B";
        }
    }

    if (!channelNames.empty()) {
        std::vector<std::string> splitChannelNames = SplitString(channelNames, ',');
        ImageChannelDesc desc = image.GetChannelDesc(splitChannelNames);
        if (!desc) {
            fprintf(stderr, "%s: image doesn't have channels \"%s\".\n", inFile.c_str(),
                    channelNames.c_str());
            return 1;
        }
        image = image.SelectChannels(desc);
    }

    Point2i res = image.Resolution();
    int nc = image.NChannels();

    // Crop
    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0) {
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
        res = image.Resolution();
    }

    // Convert to a 32-bit format for maximum accuracy in the following
    // processing.
    if (!Is32Bit(image.Format()))
        image = image.ConvertToFormat(PixelFormat::Float);

    if (!colorspace.empty()) {
        const RGBColorSpace *dest = RGBColorSpace::GetNamed(colorspace);
        if (!dest) {
            fprintf(stderr, "%s: color space unknown.\n", colorspace.c_str());
            return 1;
        }
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (!rgbDesc) {
            fprintf(stderr, "%s: doesn't have R, G, B channels.\n", inFile.c_str());
            return 1;
        }

        const RGBColorSpace *srcColorSpace = (metadata.colorSpace && *metadata.colorSpace)
                                                 ? *metadata.colorSpace
                                                 : RGBColorSpace::sRGB;
        SquareMatrix<3> m = ConvertRGBColorSpace(*srcColorSpace, *dest);
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                ImageChannelValues channels = image.GetChannels({x, y}, rgbDesc);
                RGB rgb = Mul<RGB>(m, channels);
                image.SetChannels({x, y}, rgbDesc, {rgb.r, rgb.g, rgb.b});
            }
        metadata.colorSpace = dest;
    }

    if (bw) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float sum = 0;
                for (int c = 0; c < nc; ++c)
                    sum += image.GetChannel({x, y}, c);
                sum /= nc;
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, sum);
            }
    }

    if (despikeLimit < Infinity) {
        Image filteredImg = image;
        int despikeCount = 0;
        std::vector<ImageChannelValues> neighbors;
        for (int i = 0; i < 9; ++i)
            neighbors.push_back(ImageChannelValues(image.NChannels()));

        for (int y = 0; y < res.y; ++y) {
            for (int x = 0; x < res.x; ++x) {
                if (image.GetChannels({x, y}).Average() < despikeLimit)
                    continue;

                // Copy all of the valid neighbor pixels into neighbors[].
                ++despikeCount;
                int validNeighbors = 0;
                for (int dy = -1; dy <= 1; ++dy) {
                    if (y + dy < 0 || y + dy >= res.y)
                        continue;
                    for (int dx = -1; dx <= 1; ++dx) {
                        if (x + dx < 0 || x + dx > res.x)
                            continue;
                        neighbors[validNeighbors++] = image.GetChannels({x + dx, y + dy});
                    }
                }

                // Find the median of the neighbors, sorted by average value.
                int mid = validNeighbors / 2;
                std::nth_element(
                    &neighbors[0], &neighbors[mid], &neighbors[validNeighbors],
                    [](const ImageChannelValues &a, const ImageChannelValues &b) -> bool {
                        return a.Average() < b.Average();
                    });
                filteredImg.SetChannels({x, y}, neighbors[mid]);
            }
        }
        pstd::swap(image, filteredImg);
        fprintf(stderr, "%s: despiked %d pixels\n", inFile.c_str(), despikeCount);
    }

    if (scale != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
    }

    if (gamma != 1) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < nc; ++c)
                    image.SetChannel(
                        {x, y}, c,
                        std::pow(std::max<Float>(0, image.GetChannel({x, y}, c)), gamma));
    }

    if (tonemap) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float lum = image.GetChannels({x, y}).Average();
                // Reinhard et al. photographic tone mapping operator.
                Float scale = (1 + lum / (maxY * maxY)) / (1 + lum);
                for (int c = 0; c < nc; ++c)
                    image.SetChannel({x, y}, c, scale * image.GetChannel({x, y}, c));
            }
    }

    if (preserveColors) {
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                Float m = image.GetChannel({x, y}, 0);
                for (int c = 1; c < nc; ++c)
                    m = std::max(m, image.GetChannel({x, y}, c));
                if (m > 1) {
                    for (int c = 0; c < nc; ++c)
                        image.SetChannel({x, y}, c, image.GetChannel({x, y}, c) / m);
                }
            }
    }

    if (acesFilmic) {
        // Approximation via
        // https://knarkowicz.wordpress.com/2016/01/06/aces-filmic-tone-mapping-curve/
        auto ACESFilm = [](Float x) -> Float {
            if (x <= 0)
                return 0;
            Float a = 2.51f;
            Float b = 0.03f;
            Float c = 2.43f;
            Float d = 0.59f;
            Float e = 0.14f;
            return Clamp((x * (a * x + b)) / (x * (c * x + d) + e), 0, 1);
        };

        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x) {
                for (int c = 0; c < nc; ++c) {
                    Float v = image.GetChannel({x, y}, c);
                    v = ACESFilm(v);
                    image.SetChannel({x, y}, c, v);
                }
            }
    }

    if (repeat > 1) {
        Image scaledImage(image.Format(), Point2i(res.x * repeat, res.y * repeat),
                          image.ChannelNames(), image.Encoding());
        for (int y = 0; y < repeat * res.y; ++y) {
            int yy = y / repeat;
            for (int x = 0; x < repeat * res.x; ++x) {
                int xx = x / repeat;
                for (int c = 0; c < nc; ++c)
                    scaledImage.SetChannel({x, y}, c, image.GetChannel({xx, yy}, c));
            }
        }
        image = std::move(scaledImage);
        res = image.Resolution();
    }

    if (flipy)
        image.FlipY();

    if (!image.Write(outFile))
        return 1;

    return 0;
}